

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * google::protobuf::compiler::python::anon_unknown_0::ModuleName
                   (string *__return_storage_ptr__,string *filename)

{
  undefined1 local_38 [8];
  string basename;
  string *filename_local;
  
  basename.field_2._8_8_ = filename;
  StripProto((string *)local_38,filename);
  google::protobuf::StripString((string *)local_38,"-",'_');
  google::protobuf::StripString((string *)local_38,"/",'.');
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "_pb2");
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string ModuleName(const string& filename) {
  string basename = StripProto(filename);
  StripString(&basename, "-", '_');
  StripString(&basename, "/", '.');
  return basename + "_pb2";
}